

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  long lVar6;
  uint8_t *puVar7;
  ulong uVar8;
  int y;
  int iVar9;
  undefined2 *puVar10;
  undefined2 *puVar11;
  
  peVar5 = decode->channels;
  uVar1 = peVar5->width;
  iVar2 = (decode->chunk).height;
  iVar3 = decode->user_line_end_ignore;
  iVar4 = peVar5->user_line_stride;
  puVar7 = peVar5[2].field_12.decode_to_ptr;
  iVar9 = decode->user_line_begin_skip;
  puVar10 = (undefined2 *)((long)(int)(uVar1 * 6 * iVar9) + (long)decode->unpacked_buffer);
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  for (; iVar9 < iVar2 - iVar3; iVar9 = iVar9 + 1) {
    puVar11 = puVar10;
    for (lVar6 = 0; uVar8 * 3 != lVar6; lVar6 = lVar6 + 3) {
      *(undefined2 *)(puVar7 + lVar6 * 2) = puVar11[(long)(int)uVar1 * 2];
      *(undefined2 *)(puVar7 + lVar6 * 2 + 2) = puVar11[(int)uVar1];
      *(undefined2 *)(puVar7 + lVar6 * 2 + 4) = *puVar11;
      puVar11 = puVar11 + 1;
    }
    puVar10 = (undefined2 *)((long)puVar10 + (long)(int)(uVar1 * 6));
    puVar7 = puVar7 + iVar4;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer; // B
        in1 = in0 + w;                     // G
        in2 = in1 + w;                     // R

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in2[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in0[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}